

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

bool Catch::isDebuggerActive(void)

{
  int iVar1;
  char cVar2;
  int iVar3;
  int *piVar4;
  istream *piVar5;
  bool bVar6;
  string line;
  ifstream in;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_258;
  long local_238 [65];
  
  piVar4 = __errno_location();
  iVar1 = *piVar4;
  std::ifstream::ifstream((istream *)local_238,"/proc/self/status",_S_in);
  local_258._M_string_length = 0;
  local_258.field_2._M_local_buf[0] = '\0';
  local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
  do {
    cVar2 = std::ios::widen((char)*(undefined8 *)(local_238[0] + -0x18) + (char)(istream *)local_238
                           );
    piVar5 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)local_238,(string *)&local_258,cVar2);
    if (((byte)piVar5[*(long *)(*(long *)piVar5 + -0x18) + 0x20] & 5) != 0) goto LAB_001266a8;
    iVar3 = clara::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            compare(&local_258,0,0xb,"TracerPid:\t");
  } while (iVar3 != 0);
  if (local_258._M_string_length < 0xc) {
LAB_001266a8:
    bVar6 = false;
  }
  else {
    bVar6 = local_258._M_dataplus._M_p[0xb] != '0';
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_258._M_dataplus._M_p != &local_258.field_2) {
    operator_delete(local_258._M_dataplus._M_p,
                    CONCAT71(local_258.field_2._M_allocated_capacity._1_7_,
                             local_258.field_2._M_local_buf[0]) + 1);
  }
  std::ifstream::~ifstream(local_238);
  *piVar4 = iVar1;
  return bVar6;
}

Assistant:

ErrnoGuard::~ErrnoGuard() { errno = m_oldErrno; }